

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O2

EnumValue *
cppwinrt::get_attribute_value<winmd::reader::ElemSig::EnumValue>
          (EnumValue *__return_storage_ptr__,CustomAttribute *attribute,uint32_t arg)

{
  CustomAttributeSig local_48;
  
  winmd::reader::CustomAttribute::Value(&local_48,attribute);
  get_attribute_value<winmd::reader::ElemSig::EnumValue>
            (__return_storage_ptr__,
             local_48.m_fixed_args.
             super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
             ._M_impl.super__Vector_impl_data._M_start + arg);
  winmd::reader::CustomAttributeSig::~CustomAttributeSig(&local_48);
  return __return_storage_ptr__;
}

Assistant:

auto get_attribute_value(CustomAttribute const& attribute, uint32_t const arg)
    {
        return get_attribute_value<T>(attribute.Value().FixedArgs()[arg]);
    }